

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinExport::WriteBinaryTexture(AssbinExport *this,IOStream *container,aiTexture *tex)

{
  uint uVar1;
  aiTexel *__src;
  size_t __n;
  AssbinChunkWriter chunk;
  uint32_t t;
  AssbinChunkWriter local_58;
  uint local_1c;
  
  local_58.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0082be60;
  local_58.buffer = (uint8_t *)0x0;
  local_58.magic = 0x1236;
  local_58.cur_size = 0;
  local_58.cursor = 0;
  local_58.initial = 0x1000;
  uVar1 = tex->mWidth;
  local_58.container = container;
  AssbinChunkWriter::Grow(&local_58,4);
  *(uint *)(local_58.buffer + local_58.cursor) = uVar1;
  local_58.cursor = local_58.cursor + 4;
  local_1c = tex->mHeight;
  (*local_58.super_IOStream._vptr_IOStream[3])(&local_58,&local_1c,4,1);
  if (local_58.cur_size < local_58.cursor + 4) {
    AssbinChunkWriter::Grow(&local_58,local_58.cursor + 4);
  }
  *(undefined4 *)(local_58.buffer + local_58.cursor) = *(undefined4 *)tex->achFormatHint;
  local_58.cursor = local_58.cursor + 4;
  if (this->shortened == false) {
    __n = (size_t)tex->mWidth;
    __src = tex->pcData;
    if (tex->mHeight == 0) {
      if (local_58.cur_size < local_58.cursor + __n) {
        AssbinChunkWriter::Grow(&local_58,local_58.cursor + __n);
      }
    }
    else {
      __n = (size_t)(tex->mHeight * tex->mWidth * 4);
      if (local_58.cur_size < local_58.cursor + __n) {
        AssbinChunkWriter::Grow(&local_58,local_58.cursor + __n);
      }
    }
    memcpy(local_58.buffer + local_58.cursor,__src,__n);
    local_58.cursor = local_58.cursor + __n;
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_58);
  return;
}

Assistant:

void WriteBinaryTexture(IOStream * container, const aiTexture* tex)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AITEXTURE );

        Write<unsigned int>(&chunk,tex->mWidth);
        Write<unsigned int>(&chunk,tex->mHeight);
        chunk.Write( tex->achFormatHint, sizeof(char), 4 );

        if(!shortened) {
            if (!tex->mHeight) {
                chunk.Write(tex->pcData,1,tex->mWidth);
            }
            else {
                chunk.Write(tex->pcData,1,tex->mWidth*tex->mHeight*4);
            }
        }

    }